

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void arm_rebuild_hflags_arm(CPUARMState *env)

{
  ARMMMUIdx fp_el;
  uint32_t uVar1;
  ARMMMUIdx in_ECX;
  ARMMMUIdx mmu_idx;
  uint uVar2;
  bool bVar3;
  
  uVar2 = (uint)env->features;
  if ((uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      in_ECX = env->uncached_cpsr & 0x1f;
      if (in_ECX == ARMMMUIdx_E10_0) {
        uVar2 = 0;
      }
      else if (in_ECX == ARMMMUIdx_E20_2_PAN) {
        uVar2 = 3;
      }
      else if (in_ECX == ARMMMUIdx_SE3) {
        uVar2 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar3 = in_ECX == ARMMMUIdx_E20_2_PAN;
          if (!bVar3) {
            bVar3 = ((env->cp15).scr_el3 & 1) == 0;
          }
          in_ECX = (ARMMMUIdx)bVar3;
          if (((uVar2 >> 0x1c & 1) == 0) && (uVar2 = 3, bVar3 != false)) goto LAB_0058c678;
        }
        uVar2 = 1;
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar2 = 1;
    if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0058c678:
  fp_el = arm_mmu_idx_el_arm(env,uVar2);
  if (env->aarch64 == 0) {
    if ((env->features & 0x200) == 0) {
      uVar1 = rebuild_hflags_a32(env,fp_el,mmu_idx);
    }
    else {
      uVar1 = rebuild_hflags_m32(env,fp_el,mmu_idx);
    }
  }
  else {
    uVar1 = rebuild_hflags_a64(env,uVar2,fp_el,in_ECX);
  }
  env->hflags = uVar1;
  return;
}

Assistant:

void arm_rebuild_hflags(CPUARMState *env)
{
    env->hflags = rebuild_hflags_internal(env);
}